

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wl_window.c
# Opt level: O2

void dataDeviceHandleEnter
               (void *userData,wl_data_device *device,uint32_t serial,wl_surface *surface,
               wl_fixed_t x,wl_fixed_t y,wl_data_offer *offer)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  long lVar3;
  _GLFWwindow *p_Var4;
  char **ppcVar5;
  long lVar6;
  
  if (_glfw.wl.dragOffer != (wl_data_offer *)0x0) {
    wl_data_offer_destroy(_glfw.wl.dragOffer);
    _glfw.wl.dragOffer = (wl_data_offer *)0x0;
    _glfw.wl.dragFocus = (_GLFWwindow *)0x0;
  }
  lVar3 = 0;
  do {
    lVar6 = lVar3;
    if ((ulong)_glfw.wl.offerCount * 0x10 + 0x10 == lVar6 + 0x10) goto LAB_001232c2;
    lVar3 = lVar6 + 0x10;
  } while (*(wl_data_offer **)((long)&(_glfw.wl.offers)->offer + lVar6) != offer);
  (*_glfw.wl.client.proxy_get_tag)((wl_proxy *)surface);
  p_Var4 = (_GLFWwindow *)(*_glfw.wl.client.proxy_get_user_data)((wl_proxy *)surface);
  if (((p_Var4->wl).surface == surface) &&
     (*(int *)((long)&(_glfw.wl.offers)->text_uri_list + lVar6) != 0)) {
    _glfw.wl.dragOffer = offer;
    _glfw.wl.dragFocus = p_Var4;
    _glfw.wl.dragSerial = serial;
  }
  uVar2 = *(undefined8 *)&_glfw.wl.offers[_glfw.wl.offerCount - 1].text_plain_utf8;
  puVar1 = (undefined8 *)((long)&(_glfw.wl.offers)->offer + lVar6);
  *puVar1 = _glfw.wl.offers[_glfw.wl.offerCount - 1].offer;
  puVar1[1] = uVar2;
  _glfw.wl.offerCount = _glfw.wl.offerCount - 1;
LAB_001232c2:
  ppcVar5 = (*_glfw.wl.client.proxy_get_tag)((wl_proxy *)surface);
  if (ppcVar5 != (char **)0x17b040) {
    return;
  }
  if (_glfw.wl.dragOffer != (wl_data_offer *)0x0) {
    wl_data_offer_accept(offer,serial,"text/uri-list");
    return;
  }
  wl_data_offer_accept(offer,serial,(char *)0x0);
  wl_data_offer_destroy(offer);
  return;
}

Assistant:

static void dataDeviceHandleEnter(void* userData,
                                  struct wl_data_device* device,
                                  uint32_t serial,
                                  struct wl_surface* surface,
                                  wl_fixed_t x,
                                  wl_fixed_t y,
                                  struct wl_data_offer* offer)
{
    if (_glfw.wl.dragOffer)
    {
        wl_data_offer_destroy(_glfw.wl.dragOffer);
        _glfw.wl.dragOffer = NULL;
        _glfw.wl.dragFocus = NULL;
    }

    for (unsigned int i = 0; i < _glfw.wl.offerCount; i++)
    {
        if (_glfw.wl.offers[i].offer == offer)
        {
            _GLFWwindow* window = NULL;

            if (surface)
            {
                if (wl_proxy_get_tag((struct wl_proxy*) surface) == &_glfw.wl.tag)
                    window = wl_surface_get_user_data(surface);
            }

            if (surface == window->wl.surface && _glfw.wl.offers[i].text_uri_list)
            {
                _glfw.wl.dragOffer = offer;
                _glfw.wl.dragFocus = window;
                _glfw.wl.dragSerial = serial;
            }

            _glfw.wl.offers[i] = _glfw.wl.offers[_glfw.wl.offerCount - 1];
            _glfw.wl.offerCount--;
            break;
        }
    }

    if (wl_proxy_get_tag((struct wl_proxy*) surface) != &_glfw.wl.tag)
        return;

    if (_glfw.wl.dragOffer)
        wl_data_offer_accept(offer, serial, "text/uri-list");
    else
    {
        wl_data_offer_accept(offer, serial, NULL);
        wl_data_offer_destroy(offer);
    }
}